

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

void xmlCleanupEncodingAliases(void)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  
  if (xmlCharEncodingAliases != (xmlCharEncodingAliasPtr)0x0) {
    if (0 < xmlCharEncodingAliasesNb) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        pvVar1 = *(void **)((long)&xmlCharEncodingAliases->name + lVar2);
        if (pvVar1 != (void *)0x0) {
          (*xmlFree)(pvVar1);
        }
        pvVar1 = *(void **)((long)&xmlCharEncodingAliases->alias + lVar2);
        if (pvVar1 != (void *)0x0) {
          (*xmlFree)(pvVar1);
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x10;
      } while (lVar3 < xmlCharEncodingAliasesNb);
    }
    xmlCharEncodingAliasesNb = 0;
    xmlCharEncodingAliasesMax = 0;
    (*xmlFree)(xmlCharEncodingAliases);
    xmlCharEncodingAliases = (xmlCharEncodingAliasPtr)0x0;
  }
  return;
}

Assistant:

void
xmlCleanupEncodingAliases(void) {
    int i;

    if (xmlCharEncodingAliases == NULL)
	return;

    for (i = 0;i < xmlCharEncodingAliasesNb;i++) {
	if (xmlCharEncodingAliases[i].name != NULL)
	    xmlFree((char *) xmlCharEncodingAliases[i].name);
	if (xmlCharEncodingAliases[i].alias != NULL)
	    xmlFree((char *) xmlCharEncodingAliases[i].alias);
    }
    xmlCharEncodingAliasesNb = 0;
    xmlCharEncodingAliasesMax = 0;
    xmlFree(xmlCharEncodingAliases);
    xmlCharEncodingAliases = NULL;
}